

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  curl_proxytype cVar1;
  ssl_connection_state sVar2;
  curl_slist *pcVar3;
  void *pvVar4;
  byte bVar5;
  char cVar6;
  unsigned_short uVar7;
  int iVar8;
  CURLcode CVar9;
  uint uVar10;
  CURLcode CVar11;
  curlntlm cVar12;
  size_t sVar13;
  size_t sVar14;
  connectdata *conn;
  char *pcVar15;
  size_t sVar16;
  char *pcVar17;
  char *pcVar18;
  size_t sVar19;
  hostname *phVar20;
  byte *pbVar21;
  ulong uVar22;
  byte *pbVar23;
  ushort **ppuVar24;
  long lVar25;
  Curl_handler *pCVar26;
  time_t tVar27;
  connectbundle *pcVar28;
  curl_llist_element *pcVar29;
  connectdata *pcVar30;
  _Bool _Var31;
  ulong uVar32;
  connectdata *pcVar33;
  byte bVar34;
  byte *pbVar35;
  Curl_handler **ppCVar36;
  Curl_easy *pCVar37;
  conncache *connc;
  char **optionsp_00;
  curl_slist **ppcVar38;
  ulong uVar39;
  bool bVar40;
  bool bVar41;
  timeval tVar42;
  long local_328;
  connectdata *local_320;
  connectdata *local_310;
  char *local_308;
  curl_llist_element *local_2f0;
  char *passwd;
  char *user;
  hostname *local_2d0;
  ulong local_2c8;
  char *newname;
  ulong local_2b8;
  size_t local_2b0;
  ssl_primary_config *local_2a8;
  char **local_2a0;
  _Bool *local_298;
  size_t local_290;
  connectdata **local_288;
  char *optionsp;
  char *passwdp;
  ssl_primary_config *local_270;
  hostname *local_268;
  ulong local_260;
  proxy_info *local_258;
  proxy_info *local_250;
  curl_llist *local_248;
  curl_llist *local_240;
  char protobuf [16];
  char slashbuf [4];
  
  user = (char *)0x0;
  passwd = (char *)0x0;
  sVar13 = Curl_multi_max_host_connections(data->multi);
  sVar14 = Curl_multi_max_total_connections(data->multi);
  *async = false;
  local_308 = (char *)0x0;
  if ((data->change).url == (char *)0x0) {
    CVar9 = CURLE_URL_MALFORMAT;
    goto LAB_004c1a80;
  }
  local_2b0 = sVar13;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x760);
  if (conn == (connectdata *)0x0) goto LAB_004c1a79;
  conn->handler = &Curl_handler_dummy;
  conn->connection_id = -1;
  conn->port = -1;
  conn->remote_port = -1;
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->tempsock[0] = -1;
  conn->tempsock[1] = -1;
  local_288 = in_connect;
  Curl_conncontrol(conn,1);
  tVar42 = curlx_tvnow();
  conn->created = tVar42;
  conn->data = data;
  cVar1 = (data->set).proxytype;
  (conn->http_proxy).proxytype = cVar1;
  (conn->socks_proxy).proxytype = CURLPROXY_SOCKS4;
  pcVar15 = (data->set).str[0x15];
  if (pcVar15 == (char *)0x0) {
    (conn->bits).proxy = false;
    bVar40 = false;
    _Var31 = false;
  }
  else {
    bVar40 = *pcVar15 != '\0';
    (conn->bits).proxy = bVar40;
    _Var31 = cVar1 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) && bVar40;
  }
  (conn->bits).httpproxy = _Var31;
  (conn->bits).socksproxy = (_Bool)((_Var31 ^ 1U) & bVar40);
  pcVar15 = (data->set).str[0x16];
  if ((pcVar15 != (char *)0x0) && (*pcVar15 != '\0')) {
    (conn->bits).proxy = true;
    (conn->bits).socksproxy = true;
  }
  (conn->bits).proxy_user_passwd = (data->set).str[0x2c] != (char *)0x0;
  (conn->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (conn->bits).user_passwd = (data->set).str[0x29] != (char *)0x0;
  (conn->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (conn->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  (conn->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
  (conn->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
  (conn->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
  (conn->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
  (conn->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
  (conn->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
  conn->ip_version = (data->set).ipver;
  local_290 = sVar14;
  _Var31 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var31) && (conn->master_buffer == (char *)0x0)) {
    pcVar15 = (char *)(*Curl_ccalloc)(0x4000,1);
    conn->master_buffer = pcVar15;
    if (pcVar15 != (char *)0x0) goto LAB_004c1852;
LAB_004c1a14:
    local_308 = (char *)0x0;
    Curl_llist_destroy(&conn->send_pipe,(void *)0x0);
    Curl_llist_destroy(&conn->recv_pipe,(void *)0x0);
    (*Curl_cfree)(conn->master_buffer);
    (*Curl_cfree)(conn->localdev);
    (*Curl_cfree)(conn);
    goto LAB_004c1a7c;
  }
LAB_004c1852:
  local_240 = &conn->send_pipe;
  Curl_llist_init(local_240,llist_dtor);
  Curl_llist_init(&conn->recv_pipe,llist_dtor);
  pcVar15 = (data->set).str[8];
  if (pcVar15 != (char *)0x0) {
    pcVar15 = (*Curl_cstrdup)(pcVar15);
    conn->localdev = pcVar15;
    if (pcVar15 == (char *)0x0) goto LAB_004c1a14;
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar4 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar4;
  *local_288 = conn;
  sVar16 = strlen((data->change).url);
  sVar19 = 0x100;
  if (0x100 < sVar16) {
    sVar19 = sVar16;
  }
  (*Curl_cfree)((data->state).pathbuffer);
  (data->state).pathbuffer = (char *)0x0;
  (data->state).path = (char *)0x0;
  pcVar15 = (char *)(*Curl_cmalloc)(sVar19 + 2);
  (data->state).pathbuffer = pcVar15;
  if (pcVar15 == (char *)0x0) {
LAB_004c1a79:
    local_308 = (char *)0x0;
  }
  else {
    (data->state).path = pcVar15;
    pcVar15 = (char *)(*Curl_cmalloc)(sVar19 + 2);
    (conn->host).rawalloc = pcVar15;
    if (pcVar15 == (char *)0x0) {
      (*Curl_cfree)((data->state).pathbuffer);
      (data->state).pathbuffer = (char *)0x0;
      (data->state).path = (char *)0x0;
      goto LAB_004c1a79;
    }
    local_328 = 1;
    (conn->host).name = pcVar15;
    *pcVar15 = '\0';
    local_298 = async;
    local_248 = &conn->recv_pipe;
    pcVar15 = (*Curl_cstrdup)("");
    user = pcVar15;
    pcVar17 = (*Curl_cstrdup)("");
    passwd = pcVar17;
    local_308 = (*Curl_cstrdup)("");
    if (local_308 == (char *)0x0 || (pcVar17 == (char *)0x0 || pcVar15 == (char *)0x0))
    goto LAB_004c1a7c;
    pbVar23 = (byte *)(data->state).path;
    pbVar21 = (byte *)(data->change).url;
    pcVar15 = strpbrk((char *)pbVar21,"\r\n");
    if (pcVar15 != (char *)0x0) {
      pcVar15 = "Illegal characters found in URL";
LAB_004c1c61:
      Curl_failf(data,pcVar15);
      CVar9 = CURLE_URL_MALFORMAT;
      goto LAB_004c1a80;
    }
    if (*pbVar21 == 0x3a) {
      pcVar15 = "Bad URL, colon is first character";
      goto LAB_004c1c61;
    }
    if ((((0x19 < (byte)((*pbVar21 & 0xdf) + 0xbf)) || (pbVar21[1] != 0x3a)) ||
        (pcVar15 = (data->set).str[7], pcVar15 == (char *)0x0)) ||
       (iVar8 = Curl_strcasecompare(pcVar15,"file"), iVar8 == 0)) {
      for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 1) {
        pcVar15 = (data->change).url;
        cVar6 = pcVar15[lVar25];
        if ((cVar6 == '\0') || (cVar6 == '/')) break;
        if (cVar6 == ':') {
          iVar8 = Curl_strncasecompare(pcVar15,"file:",5);
          if (iVar8 == 0) goto LAB_004c1c1c;
          iVar8 = __isoc99_sscanf((data->change).url,"%*15[^\n/:]:%[^\n]",pbVar23);
          if (iVar8 != 1) goto LAB_004c1c5a;
          bVar5 = *pbVar23;
          if (bVar5 != 0x2f) {
            bVar40 = false;
            goto LAB_004c1b4a;
          }
          if (pbVar23[1] == 0x2f) {
            sVar19 = strlen((char *)(pbVar23 + 2));
            memmove(pbVar23,pbVar23 + 2,sVar19 + 1);
          }
          bVar40 = false;
          goto LAB_004c1b47;
        }
      }
    }
    pcVar15 = (data->set).str[7];
    if ((pcVar15 != (char *)0x0) && (iVar8 = Curl_strcasecompare(pcVar15,"file"), iVar8 != 0)) {
      iVar8 = __isoc99_sscanf((data->change).url,"%[^\n]",pbVar23);
      bVar40 = true;
      if (iVar8 != 1) goto LAB_004c1c5a;
LAB_004c1b47:
      bVar5 = *pbVar23;
LAB_004c1b4a:
      if ((byte)((bVar5 & 0xdf) + 0xbf) < 0x1a) {
        if (bVar5 != 0x2f && pbVar23[1] != 0x3a) goto LAB_004c1d9e;
        if (pbVar23[1] != 0x3a) goto LAB_004c1d8d;
      }
      else {
        if (bVar5 == 0x2f) {
LAB_004c1d8d:
          local_320 = (connectdata *)0x54fdd7;
          goto LAB_004c1ee0;
        }
LAB_004c1d9e:
        iVar8 = curl_strnequal("localhost/",(char *)pbVar23,10);
        if ((iVar8 == 0) && (iVar8 = curl_strnequal("127.0.0.1/",(char *)pbVar23,10), iVar8 == 0)) {
          pcVar15 = "Invalid file://hostname/, expected localhost or 127.0.0.1 or none";
          goto LAB_004c1c61;
        }
        pbVar21 = pbVar23 + 9;
        if (pbVar23[10] == 0x2f) {
          pbVar21 = pbVar23 + 10;
        }
        sVar19 = strlen((char *)pbVar21);
        memmove(pbVar23,pbVar21,sVar19 + 1);
        local_320 = (connectdata *)0x54fdd7;
        if ((0x19 < (byte)((*pbVar23 & 0xdf) + 0xbf)) || (pbVar23[1] != 0x3a)) goto LAB_004c1ee0;
      }
      pcVar15 = "File drive letters are only accepted in MSDOS/Windows.";
      goto LAB_004c1c61;
    }
LAB_004c1c1c:
    *pbVar23 = 0;
    iVar8 = __isoc99_sscanf((data->change).url,"%15[^\n/:]:%3[/]%[^\n/?#]%[^\n]",protobuf,slashbuf);
    if (iVar8 == 2) {
LAB_004c1c5a:
      pcVar15 = "Bad URL";
      goto LAB_004c1c61;
    }
    if (2 < iVar8) {
      sVar19 = strlen(slashbuf);
      if (sVar19 == 2) {
LAB_004c1d7c:
        local_320 = (connectdata *)protobuf;
        bVar40 = false;
        goto LAB_004c1ee0;
      }
      pcVar15 = "es";
      if (sVar19 < 2) {
        pcVar15 = "";
      }
      Curl_infof(data,"Unwillingly accepted illegal URL using %d slash%s!\n",sVar19,pcVar15);
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
      }
      pcVar15 = curl_maprintf("%s://%s%s",protobuf,(conn->host).name,pbVar23);
      (data->change).url = pcVar15;
      if (pcVar15 != (char *)0x0) {
        (data->change).url_alloc = true;
        goto LAB_004c1d7c;
      }
LAB_004c226e:
      CVar9 = CURLE_OUT_OF_MEMORY;
      goto LAB_004c1a80;
    }
    iVar8 = __isoc99_sscanf((data->change).url,"%[^\n/?#]%[^\n]",(conn->host).name,pbVar23);
    if (iVar8 < 1) goto LAB_004c2275;
    local_320 = (connectdata *)(data->set).str[7];
    bVar41 = true;
    bVar40 = true;
    if (local_320 == (connectdata *)0x0) {
      iVar8 = curl_strnequal("FTP.",(conn->host).name,4);
      if (iVar8 == 0) {
        iVar8 = curl_strnequal("DICT.",(conn->host).name,5);
        bVar40 = bVar41;
        if (iVar8 == 0) {
          iVar8 = curl_strnequal("LDAP.",(conn->host).name,5);
          if (iVar8 == 0) {
            iVar8 = curl_strnequal("IMAP.",(conn->host).name,5);
            if (iVar8 == 0) {
              iVar8 = curl_strnequal("SMTP.",(conn->host).name,5);
              if (iVar8 == 0) {
                iVar8 = curl_strnequal("POP3.",(conn->host).name,5);
                local_320 = (connectdata *)0x55242a;
                if (iVar8 == 0) {
                  local_320 = (connectdata *)0x539d41;
                }
              }
              else {
                local_320 = (connectdata *)0x55241f;
              }
            }
            else {
              local_320 = (connectdata *)0x552414;
            }
          }
          else {
            local_320 = (connectdata *)0x552409;
          }
        }
        else {
          local_320 = (connectdata *)0x5523fe;
        }
      }
      else {
        local_320 = (connectdata *)0x539d46;
      }
    }
LAB_004c1ee0:
    pcVar15 = (conn->host).name;
    pcVar18 = strchr(pcVar15,0x40);
    pcVar17 = pcVar18 + 1;
    if (pcVar18 == (char *)0x0) {
      pcVar17 = pcVar15;
    }
    pcVar15 = strchr(pcVar17,0x3f);
    bVar41 = pcVar15 != (char *)0x0;
    if (pcVar15 == (char *)0x0) {
      bVar5 = *pbVar23;
      if (bVar5 != 0) goto LAB_004c1f5f;
      pbVar23[0] = 0x2f;
      pbVar23[1] = 0;
      bVar41 = true;
LAB_004c1f8c:
      if ((data->set).path_as_is == false) {
        pbVar21 = (byte *)Curl_dedotdotify((char *)pbVar23);
        if (pbVar21 == (byte *)0x0) goto LAB_004c226e;
        iVar8 = strcmp((char *)pbVar21,(char *)pbVar23);
        if (iVar8 != 0) {
          (*Curl_cfree)((data->state).pathbuffer);
          (data->state).pathbuffer = (char *)pbVar21;
          (data->state).path = (char *)pbVar21;
          goto LAB_004c1fea;
        }
        (*Curl_cfree)(pbVar21);
      }
      pbVar21 = pbVar23;
      if (bVar41) goto LAB_004c1fea;
    }
    else {
      sVar19 = strlen(pcVar15);
      sVar16 = strlen((char *)pbVar23);
      memmove(pbVar23 + sVar19 + 1,pbVar23,sVar16 + 1);
      memcpy(pbVar23 + 1,pcVar15,sVar19);
      *pbVar23 = 0x2f;
      *pcVar15 = '\0';
      bVar5 = *pbVar23;
LAB_004c1f5f:
      if (bVar5 == 0x2f) goto LAB_004c1f8c;
      sVar19 = strlen((char *)pbVar23);
      memmove(pbVar23 + 1,pbVar23,sVar19 + 1);
      *pbVar23 = 0x2f;
      pbVar21 = pbVar23;
LAB_004c1fea:
      phVar20 = (hostname *)strlen((char *)pbVar21);
      sVar19 = strlen((conn->host).name);
      if (!bVar40) {
        local_2d0 = phVar20;
        sVar16 = strlen((char *)local_320);
        iVar8 = curl_strnequal((char *)local_320,(data->change).url,sVar16);
        if (iVar8 == 0) {
LAB_004c2275:
          pcVar15 = "<url> malformed";
          goto LAB_004c1c61;
        }
        iVar8 = curl_strnequal("://",(data->change).url + sVar16,3);
        if (iVar8 == 0) {
          iVar8 = curl_strnequal("file:",(data->change).url,5);
          if (iVar8 == 0) goto LAB_004c2275;
          sVar19 = (ulong)((data->change).url[5] == '/') + sVar19 + sVar16 + 1;
          phVar20 = local_2d0;
        }
        else {
          sVar19 = sVar19 + sVar16 + 3;
          phVar20 = local_2d0;
        }
      }
      pcVar15 = (char *)(*Curl_cmalloc)((long)&phVar20->rawalloc + sVar19 + 1);
      if (pcVar15 == (char *)0x0) goto LAB_004c226e;
      memcpy(pcVar15,(data->change).url,sVar19);
      local_2d0 = (hostname *)pcVar15;
      memcpy(pcVar15 + sVar19,pbVar21,(size_t)((long)&phVar20->rawalloc + 1));
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
        (data->change).url = (char *)0x0;
        (data->change).url_alloc = false;
      }
      phVar20 = local_2d0;
      Curl_infof(data,"Rebuilt URL to: %s\n",local_2d0);
      (data->change).url = (char *)phVar20;
      (data->change).url_alloc = true;
      pbVar23 = pbVar21;
    }
    local_2d0 = &conn->host;
    ppCVar36 = protocols;
    do {
      pCVar26 = *ppCVar36;
      if (pCVar26 == (Curl_handler *)0x0) goto LAB_004c224b;
      iVar8 = Curl_strcasecompare(pCVar26->scheme,(char *)local_320);
      ppCVar36 = ppCVar36 + 1;
    } while (iVar8 == 0);
    if ((((uint)(data->set).allowed_protocols & pCVar26->protocol) == 0) ||
       (((data->state).this_is_a_follow == true &&
        (((uint)(data->set).redir_protocols & pCVar26->protocol) == 0)))) {
LAB_004c224b:
      Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_320);
      CVar9 = CURLE_UNSUPPORTED_PROTOCOL;
      goto LAB_004c1a80;
    }
    conn->given = pCVar26;
    conn->handler = pCVar26;
    _slashbuf = (char *)0x0;
    passwdp = (char *)0x0;
    optionsp = (char *)0x0;
    pcVar15 = (conn->host).name;
    pcVar17 = strchr(pcVar15,0x40);
    CVar9 = CURLE_OK;
    if (pcVar17 != (char *)0x0) {
      (conn->host).name = pcVar17 + 1;
      if ((data->set).use_netrc != CURL_NETRC_REQUIRED) {
        optionsp_00 = &optionsp;
        if ((pCVar26->flags >> 10 & 1) == 0) {
          optionsp_00 = (char **)0x0;
        }
        CVar9 = parse_login_details(pcVar15,(size_t)(pcVar17 + 1 + ~(ulong)pcVar15),
                                    (char **)slashbuf,&passwdp,optionsp_00);
        if (CVar9 == CURLE_OK) {
          if (_slashbuf != (char *)0x0) {
            (conn->bits).userpwd_in_url = true;
            (conn->bits).user_passwd = true;
            CVar9 = Curl_urldecode(data,_slashbuf,0,&newname,(size_t *)0x0,false);
            if (CVar9 != CURLE_OK) goto LAB_004c231d;
            (*Curl_cfree)(user);
            user = newname;
          }
          if (passwdp != (char *)0x0) {
            CVar9 = Curl_urldecode(data,passwdp,0,&newname,(size_t *)0x0,false);
            if (CVar9 != CURLE_OK) goto LAB_004c231d;
            (*Curl_cfree)(passwd);
            passwd = newname;
          }
          if (optionsp == (char *)0x0) {
            CVar9 = CURLE_OK;
          }
          else {
            CVar9 = Curl_urldecode(data,optionsp,0,&newname,(size_t *)0x0,false);
            if (CVar9 == CURLE_OK) {
              (*Curl_cfree)(local_308);
              local_308 = newname;
            }
          }
        }
      }
    }
LAB_004c231d:
    (*Curl_cfree)(_slashbuf);
    (*Curl_cfree)(passwdp);
    (*Curl_cfree)(optionsp);
    if (CVar9 != CURLE_OK) goto LAB_004c1a80;
    pcVar15 = (conn->host).name;
    if ((*pcVar15 == '[') && (pbVar21 = (byte *)strchr(pcVar15,0x25), pbVar21 != (byte *)0x0)) {
      iVar8 = *pbVar21 - 0x25;
      if ((iVar8 == 0) && (iVar8 = pbVar21[1] - 0x32, iVar8 == 0)) {
        iVar8 = 0x35 - (uint)pbVar21[2];
      }
      else {
        iVar8 = -iVar8;
      }
      if (iVar8 == 0) {
        local_328 = 3;
      }
      else {
        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
      }
      uVar22 = strtoul((char *)(pbVar21 + local_328),(char **)slashbuf,10);
      pcVar15 = _slashbuf;
      if (*_slashbuf == ']') {
        sVar19 = strlen(_slashbuf);
        memmove(pbVar21,pcVar15,sVar19 + 1);
        conn->scope_id = (uint)uVar22;
      }
      else {
        Curl_infof(data,"Invalid IPv6 address format\n");
      }
    }
    uVar10 = (data->set).scope_id;
    if (uVar10 != 0) {
      conn->scope_id = uVar10;
    }
    pcVar15 = strchr((char *)pbVar23,0x23);
    if (pcVar15 != (char *)0x0) {
      *pcVar15 = '\0';
      pcVar15 = strchr((data->change).url,0x23);
      if (pcVar15 != (char *)0x0) {
        *pcVar15 = '\0';
      }
    }
    if (bVar40) {
      pbVar21 = (byte *)curl_maprintf("%s://%s",conn->handler->scheme,(data->change).url);
      pbVar23 = pbVar21;
      if (pbVar21 == (byte *)0x0) goto LAB_004c1a7c;
      for (; *pbVar23 != 0x3a; pbVar23 = pbVar23 + 1) {
        iVar8 = tolower((uint)*pbVar23);
        *pbVar23 = (byte)iVar8;
      }
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
      }
      (data->change).url = (char *)pbVar21;
      (data->change).url_alloc = true;
    }
    if (((conn->given->flags & 0x40) != 0) &&
       (pcVar15 = strchr((conn->data->state).path,0x3f), pcVar15 != (char *)0x0)) {
      *pcVar15 = '\0';
    }
    pcVar15 = (data->set).str[0x35];
    if (pcVar15 != (char *)0x0) {
      pcVar15 = (*Curl_cstrdup)(pcVar15);
      conn->oauth_bearer = pcVar15;
      if (pcVar15 == (char *)0x0) goto LAB_004c1a7c;
    }
    pCVar37 = conn->data;
    if ((conn->bits).proxy_user_passwd == true) {
      memset(protobuf,0,0x100);
      memset(slashbuf,0,0x100);
      pcVar15 = (pCVar37->set).str[0x2c];
      if (pcVar15 != (char *)0x0) {
        strncpy(protobuf,pcVar15,0x100);
      }
      pcVar15 = (pCVar37->set).str[0x2d];
      if (pcVar15 != (char *)0x0) {
        strncpy(slashbuf,pcVar15,0x100);
      }
      CVar9 = Curl_urldecode(pCVar37,protobuf,0,&(conn->http_proxy).user,(size_t *)0x0,false);
      if (CVar9 != CURLE_OK) {
LAB_004c25da:
        pcVar15 = (char *)0x0;
        goto LAB_004c2a10;
      }
      pcVar15 = (char *)0x0;
      CVar9 = Curl_urldecode(pCVar37,slashbuf,0,&(conn->http_proxy).passwd,(size_t *)0x0,false);
      pcVar17 = (char *)0x0;
      if (CVar9 == CURLE_OK) goto LAB_004c2618;
    }
    else {
LAB_004c2618:
      pcVar15 = (pCVar37->set).str[0x15];
      if (pcVar15 == (char *)0x0) {
        pcVar17 = (char *)0x0;
LAB_004c2654:
        pcVar15 = (pCVar37->set).str[0x16];
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar15 = (*Curl_cstrdup)(pcVar15);
          if (pcVar15 == (char *)0x0) {
            pcVar15 = (char *)0x0;
            Curl_failf(pCVar37,"memory shortage");
            CVar9 = CURLE_OUT_OF_MEMORY;
            goto LAB_004c2a13;
          }
        }
        pcVar18 = curl_getenv("no_proxy");
        if (pcVar18 == (char *)0x0) {
          pcVar18 = curl_getenv("NO_PROXY");
        }
        _Var31 = check_noproxy((conn->host).name,(pCVar37->set).str[0x2e]);
        if ((_Var31) ||
           (((pCVar37->set).str[0x2e] == (char *)0x0 &&
            (_Var31 = check_noproxy((conn->host).name,pcVar18), _Var31)))) {
          (*Curl_cfree)(pcVar17);
          (*Curl_cfree)(pcVar15);
          pcVar15 = (char *)0x0;
          pcVar17 = (char *)0x0;
        }
        else if (pcVar17 == (char *)0x0 && pcVar15 == (char *)0x0) {
          pcVar15 = conn->handler->scheme;
          for (lVar25 = 0; cVar6 = pcVar15[lVar25], cVar6 != '\0'; lVar25 = lVar25 + 1) {
            iVar8 = tolower((int)cVar6);
            protobuf[lVar25] = (char)iVar8;
          }
          builtin_strncpy(protobuf + lVar25,"_proxy",7);
          pcVar17 = curl_getenv(protobuf);
          if (pcVar17 == (char *)0x0) {
            iVar8 = Curl_strcasecompare("http_proxy",protobuf);
            if (iVar8 == 0) {
              Curl_strntoupper(protobuf,protobuf,0x80);
              pcVar17 = curl_getenv(protobuf);
              if (pcVar17 != (char *)0x0) goto LAB_004c2871;
            }
            pcVar17 = curl_getenv("all_proxy");
            if (pcVar17 == (char *)0x0) {
              pcVar17 = curl_getenv("ALL_PROXY");
            }
          }
LAB_004c2871:
          pcVar15 = (char *)0x0;
        }
        (*Curl_cfree)(pcVar18);
        if (pcVar17 == (char *)0x0) {
LAB_004c28a7:
          pcVar17 = (char *)0x0;
        }
        else if ((*pcVar17 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
          (*Curl_cfree)(pcVar17);
          goto LAB_004c28a7;
        }
        if (pcVar15 == (char *)0x0) {
LAB_004c28d8:
          if (pcVar17 != (char *)0x0) {
            pcVar15 = (char *)0x0;
            bVar40 = false;
LAB_004c28e5:
            CVar9 = parse_proxy(pCVar37,conn,pcVar17,(conn->http_proxy).proxytype);
            (*Curl_cfree)(pcVar17);
            if (CVar9 != CURLE_OK) goto LAB_004c2a10;
            if (bVar40) goto LAB_004c2917;
            goto LAB_004c2945;
          }
LAB_004c29e9:
          (conn->bits).proxy = false;
          (conn->bits).httpproxy = false;
          (conn->bits).socksproxy = false;
          (conn->bits).proxy_user_passwd = false;
          (conn->bits).tunnel_proxy = false;
        }
        else {
          if ((*pcVar15 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
            (*Curl_cfree)(pcVar15);
            goto LAB_004c28d8;
          }
          bVar40 = true;
          if (pcVar17 != (char *)0x0) goto LAB_004c28e5;
LAB_004c2917:
          CVar9 = parse_proxy(pCVar37,conn,pcVar15,(conn->socks_proxy).proxytype);
          (*Curl_cfree)(pcVar15);
          if (CVar9 != CURLE_OK) goto LAB_004c25da;
LAB_004c2945:
          if ((conn->http_proxy).host.rawalloc == (char *)0x0) {
            (conn->bits).httpproxy = false;
            (conn->bits).tunnel_proxy = false;
            if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
              (conn->bits).proxy = false;
              goto LAB_004c29e9;
            }
            if ((conn->socks_proxy).user == (char *)0x0) {
              pcVar15 = (conn->socks_proxy).passwd;
              (conn->socks_proxy).user = (conn->http_proxy).user;
              (conn->http_proxy).user = (char *)0x0;
              (*Curl_cfree)(pcVar15);
              (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
              (conn->http_proxy).passwd = (char *)0x0;
              (conn->bits).socksproxy = true;
              goto LAB_004c2993;
            }
            (conn->bits).socksproxy = true;
            (conn->bits).proxy = true;
          }
          else {
            if (((conn->handler->protocol & 3) == 0) && ((conn->bits).tunnel_proxy == false)) {
              conn->handler = &Curl_handler_http;
            }
            (conn->bits).httpproxy = true;
            (conn->bits).socksproxy = (conn->socks_proxy).host.rawalloc != (char *)0x0;
LAB_004c2993:
            (conn->bits).proxy = true;
          }
        }
        pcVar15 = (char *)0x0;
        CVar9 = CURLE_OK;
      }
      else {
        pcVar17 = (*Curl_cstrdup)(pcVar15);
        if (pcVar17 != (char *)0x0) goto LAB_004c2654;
        pcVar15 = (char *)0x0;
        Curl_failf(pCVar37,"memory shortage");
        CVar9 = CURLE_OUT_OF_MEMORY;
      }
LAB_004c2a10:
      pcVar17 = (char *)0x0;
    }
LAB_004c2a13:
    (*Curl_cfree)(pcVar15);
    (*Curl_cfree)(pcVar17);
    if (CVar9 != CURLE_OK) goto LAB_004c1a80;
    if (((conn->given->flags & 1) != 0) && ((conn->bits).httpproxy == true)) {
      (conn->bits).tunnel_proxy = true;
    }
    iVar8 = __isoc99_sscanf((conn->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",slashbuf);
    if ((iVar8 == 1) && (slashbuf[0] == ']')) {
      (conn->bits).ipv6_ip = true;
      pcVar15 = (conn->host).name + 1;
      (conn->host).name = pcVar15;
      pcVar17 = strchr(pcVar15,0x5d);
      if (pcVar17 == (char *)0x0) {
        pcVar15 = (char *)0x0;
      }
      else {
        *pcVar17 = '\0';
        pcVar15 = (char *)0x0;
        if (pcVar17[1] == ':') {
          pcVar15 = pcVar17 + 1;
        }
      }
    }
    else {
      pcVar15 = strchr((conn->host).name,0x3a);
    }
    lVar25 = (data->set).use_port;
    if ((lVar25 == 0) || ((data->state).allow_port != true)) {
      if (pcVar15 != (char *)0x0) {
        uVar22 = strtol(pcVar15 + 1,(char **)protobuf,10);
        if (uVar22 < 0x10000) {
          if (*(char *)protobuf._0_8_ == '\0') {
            *pcVar15 = '\0';
            if ((char *)protobuf._0_8_ != pcVar15 + 1) {
              uVar7 = curlx_ultous(uVar22);
              conn->remote_port = (uint)uVar7;
            }
            goto LAB_004c2cf2;
          }
          Curl_failf(data,"Port number ended with \'%c\'");
        }
        else {
          Curl_failf(data,"Port number out of range");
        }
        CVar9 = CURLE_URL_MALFORMAT;
        goto LAB_004c1a80;
      }
    }
    else {
      conn->remote_port = (uint)lVar25 & 0xffff;
      if (pcVar15 != (char *)0x0) {
        *pcVar15 = '\0';
      }
      if ((conn->bits).httpproxy == true) {
        protobuf[8] = '\0';
        protobuf[9] = '\0';
        protobuf[10] = '\0';
        protobuf[0xb] = '\0';
        protobuf[0] = '\0';
        protobuf[1] = '\0';
        protobuf[2] = '\0';
        protobuf[3] = '\0';
        protobuf[4] = '\0';
        protobuf[5] = '\0';
        protobuf[6] = '\0';
        protobuf[7] = '\0';
        if ((conn->bits).type_set == true) {
          if ((data->set).prefer_ascii == false) {
            uVar22 = (ulong)(((data->set).ftp_list_only ^ 1) * 5 + 0x44);
          }
          else {
            uVar22 = 0x41;
          }
          curl_msnprintf(protobuf,0xc,";type=%c",uVar22);
        }
        pcVar15 = "[";
        bVar40 = (conn->bits).ipv6_ip == false;
        if (bVar40) {
          pcVar15 = "";
        }
        pcVar17 = "]";
        if (bVar40) {
          pcVar17 = "";
        }
        pcVar18 = "/";
        if ((data->state).slash_removed == false) {
          pcVar18 = "";
        }
        pcVar15 = curl_maprintf("%s://%s%s%s:%hu%s%s%s",conn->given->scheme,pcVar15,
                                (conn->host).name,pcVar17,(ulong)(uint)conn->remote_port,pcVar18,
                                (data->state).path,protobuf);
        if (pcVar15 == (char *)0x0) goto LAB_004c1a7c;
        if ((data->change).url_alloc == true) {
          (*Curl_cfree)((data->change).url);
        }
        (data->change).url = pcVar15;
        (data->change).url_alloc = true;
      }
    }
LAB_004c2cf2:
    if (conn->remote_port < 0) {
      conn->remote_port = (uint)(ushort)conn->given->defport;
    }
    if ((data->set).str[0x29] != (char *)0x0) {
      (*Curl_cfree)(user);
      user = (*Curl_cstrdup)((data->set).str[0x29]);
      if (user == (char *)0x0) goto LAB_004c1a7c;
    }
    if ((data->set).str[0x2a] != (char *)0x0) {
      (*Curl_cfree)(passwd);
      passwd = (*Curl_cstrdup)((data->set).str[0x2a]);
      if (passwd == (char *)0x0) goto LAB_004c1a7c;
    }
    if ((data->set).str[0x2b] != (char *)0x0) {
      (*Curl_cfree)(local_308);
      local_308 = (*Curl_cstrdup)((data->set).str[0x2b]);
      if (local_308 == (char *)0x0) goto LAB_004c1a79;
    }
    (conn->bits).netrc = false;
    if ((data->set).use_netrc != CURL_NETRC_IGNORED) {
      iVar8 = Curl_parsenetrc((conn->host).name,&user,&passwd,(data->set).str[0x14]);
      if (iVar8 < 1) {
        if (iVar8 < 0) goto LAB_004c1a7c;
        (conn->bits).netrc = true;
        (conn->bits).user_passwd = true;
      }
      else {
        Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                   (conn->host).name);
      }
    }
    pcVar15 = passwd;
    if (((conn->handler->flags & 0x20) == 0) || ((conn->bits).user_passwd != false)) {
      pcVar17 = (*Curl_cstrdup)(user);
      conn->user = pcVar17;
      if (pcVar17 == (char *)0x0) goto LAB_004c2ed1;
LAB_004c2ec6:
      pcVar15 = (*Curl_cstrdup)(pcVar15);
    }
    else {
      pcVar15 = (*Curl_cstrdup)("anonymous");
      conn->user = pcVar15;
      if (pcVar15 != (char *)0x0) {
        pcVar15 = "ftp@example.com";
        goto LAB_004c2ec6;
      }
LAB_004c2ed1:
      pcVar15 = (char *)0x0;
    }
    conn->passwd = pcVar15;
    if ((conn->user == (char *)0x0) || (pcVar15 == (char *)0x0)) goto LAB_004c1a7c;
    if (*local_308 != '\0') {
      pcVar15 = (*Curl_cstrdup)(local_308);
      conn->options = pcVar15;
      if (pcVar15 == (char *)0x0) goto LAB_004c1a7c;
    }
    local_2a0 = &conn->user;
    ppcVar38 = &(data->set).connect_to;
    local_268 = &conn->conn_to_host;
    pcVar15 = (char *)0x0;
    uVar22 = 0xffffffff;
LAB_004c2f5a:
    if ((((int)uVar22 == -1) && (pcVar15 == (char *)0x0)) &&
       (pcVar3 = *ppcVar38, pcVar3 != (curl_slist *)0x0)) {
      pcVar15 = pcVar3->data;
      if (*pcVar15 == ':') {
LAB_004c3012:
        if (pcVar15[1] != ':') {
          pcVar17 = strchr(pcVar15 + 1,0x3a);
          if (pcVar17 != (char *)0x0) {
            protobuf[0] = '\0';
            protobuf[1] = '\0';
            protobuf[2] = '\0';
            protobuf[3] = '\0';
            protobuf[4] = '\0';
            protobuf[5] = '\0';
            protobuf[6] = '\0';
            protobuf[7] = '\0';
            lVar25 = strtol(pcVar15 + 1,(char **)protobuf,10);
            if (((char *)protobuf._0_8_ == pcVar17) && (lVar25 == conn->remote_port)) {
              pcVar15 = pcVar17 + 1;
              goto LAB_004c3021;
            }
          }
          goto LAB_004c30f6;
        }
        pcVar15 = pcVar15 + 2;
LAB_004c3021:
        if (*pcVar15 == '\0') goto LAB_004c30f6;
        pbVar23 = (byte *)(*Curl_cstrdup)(pcVar15);
        if (pbVar23 != (byte *)0x0) {
          pbVar21 = pbVar23;
          local_320 = (connectdata *)pbVar23;
          if (*pbVar23 == 0x5b) {
            local_320 = (connectdata *)(pbVar23 + 1);
            pbVar35 = pbVar23 + 2;
            pbVar21 = (byte *)local_320;
            while( true ) {
              bVar5 = *pbVar21;
              if ((ulong)bVar5 == 0) break;
              ppuVar24 = __ctype_b_loc();
              if (((((*ppuVar24)[bVar5] >> 0xc & 1) == 0) && (bVar5 != 0x2e)) && (bVar5 != 0x3a)) {
                if (bVar5 != 0x25) goto LAB_004c317d;
                if (pbVar21[1] - 0x32 == 0) {
                  iVar8 = 0x35 - (uint)pbVar21[2];
                }
                else {
                  iVar8 = -(pbVar21[1] - 0x32);
                }
                if (iVar8 != 0) {
                  Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                }
                goto LAB_004c31a7;
              }
              pbVar21 = pbVar21 + 1;
              pbVar35 = pbVar35 + 1;
            }
            goto LAB_004c31d6;
          }
          goto LAB_004c31e9;
        }
      }
      else {
        bVar40 = (conn->bits).ipv6_ip != false;
        pcVar17 = "";
        pcVar18 = "";
        if (bVar40) {
          pcVar18 = "[";
        }
        if (bVar40) {
          pcVar17 = "]";
        }
        pcVar17 = curl_maprintf("%s%s%s",pcVar18,(conn->host).name,pcVar17);
        if (pcVar17 != (char *)0x0) {
          sVar19 = strlen(pcVar17);
          iVar8 = Curl_strncasecompare(pcVar15,pcVar17,sVar19);
          (*Curl_cfree)(pcVar17);
          if ((iVar8 != 0) && (pcVar15[sVar19] == ':')) {
            pcVar15 = pcVar15 + sVar19;
            goto LAB_004c3012;
          }
LAB_004c30f6:
          pcVar15 = (char *)0x0;
          uVar22 = 0xffffffff;
          goto LAB_004c30ff;
        }
      }
      goto LAB_004c1a7c;
    }
    fix_hostname(conn,local_2d0);
    if ((conn->bits).conn_to_host == true) {
      fix_hostname(conn,local_268);
    }
    if ((conn->bits).httpproxy == true) {
      fix_hostname(conn,&(conn->http_proxy).host);
    }
    if ((conn->bits).socksproxy == true) {
      fix_hostname(conn,&(conn->socks_proxy).host);
    }
    if (((conn->bits).conn_to_host == true) &&
       (iVar8 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name), iVar8 != 0)) {
      (conn->bits).conn_to_host = false;
    }
    cVar6 = (conn->bits).conn_to_port;
    if (((_Bool)cVar6 == true) && (conn->conn_to_port == conn->remote_port)) {
      (conn->bits).conn_to_port = false;
      cVar6 = '\0';
    }
    if ((((conn->bits).conn_to_host != false) || (cVar6 != '\0')) &&
       ((conn->bits).httpproxy == true)) {
      (conn->bits).tunnel_proxy = true;
    }
    pCVar37 = conn->data;
    Curl_free_request_state(pCVar37);
    memset(&pCVar37->req,0,0x130);
    (pCVar37->req).maxdownload = -1;
    conn->socktype = 1;
    pCVar26 = conn->handler;
    if (pCVar26->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
      CVar9 = (*pCVar26->setup_connection)(conn);
      if (CVar9 != CURLE_OK) goto LAB_004c1a80;
      pCVar26 = conn->handler;
    }
    if (conn->port < 0) {
      conn->port = pCVar26->defport;
    }
    conn->recv[0] = Curl_recv_plain;
    conn->send[0] = Curl_send_plain;
    conn->recv[1] = Curl_recv_plain;
    conn->send[1] = Curl_send_plain;
    (conn->bits).tcp_fastopen = (data->set).tcp_fastopen;
    if ((pCVar26->flags & 0x10) != 0) {
      CVar11 = (*pCVar26->connect_it)(conn,(_Bool *)protobuf);
      if (CVar11 == CURLE_OK) {
        conn->data = data;
        (conn->bits).tcpconnect[0] = true;
        Curl_conncache_add_conn((data->state).conn_cache,conn);
        CVar9 = setup_range(data);
        if (CVar9 != CURLE_OK) {
          (*conn->handler->done)(conn,CVar9,false);
          goto LAB_004c1a80;
        }
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
      }
      Curl_init_do(data,conn);
      CVar9 = CVar11;
      goto LAB_004c1a80;
    }
    pcVar15 = (data->set).str[0x1b];
    (data->set).ssl.primary.CApath = (data->set).str[0x1a];
    (data->set).proxy_ssl.primary.CApath = pcVar15;
    (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
    (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
    pcVar15 = (data->set).str[0x23];
    (data->set).ssl.primary.random_file = pcVar15;
    (data->set).proxy_ssl.primary.random_file = pcVar15;
    pcVar15 = (data->set).str[0x22];
    (data->set).ssl.primary.egdsocket = pcVar15;
    (data->set).proxy_ssl.primary.egdsocket = pcVar15;
    (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
    (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
    (data->set).ssl.CRLfile = (data->set).str[0x25];
    (data->set).proxy_ssl.CRLfile = (data->set).str[0x26];
    (data->set).ssl.issuercert = (data->set).str[0x27];
    (data->set).proxy_ssl.issuercert = (data->set).str[0x28];
    pcVar15 = (data->set).str[0];
    pcVar17 = (data->set).str[1];
    (data->set).ssl.cert = pcVar15;
    (data->set).proxy_ssl.cert = pcVar17;
    (data->set).ssl.cert_type = (data->set).str[2];
    (data->set).proxy_ssl.cert_type = (data->set).str[3];
    (data->set).ssl.key = (data->set).str[0xd];
    (data->set).proxy_ssl.key = (data->set).str[0xe];
    (data->set).ssl.key_type = (data->set).str[0x11];
    (data->set).proxy_ssl.key_type = (data->set).str[0x12];
    pcVar18 = (data->set).str[0x10];
    (data->set).ssl.key_passwd = (data->set).str[0xf];
    (data->set).proxy_ssl.key_passwd = pcVar18;
    (data->set).ssl.primary.clientcert = pcVar15;
    (data->set).proxy_ssl.primary.clientcert = pcVar17;
    local_2a8 = &conn->ssl_config;
    _Var31 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,local_2a8);
    if (_Var31) {
      local_270 = &conn->proxy_ssl_config;
      _Var31 = Curl_clone_primary_ssl_config(&(data->set).proxy_ssl.primary,local_270);
      if (_Var31) {
        tVar42 = curlx_tvnow();
        tVar27 = curlx_tvdiff(tVar42,((data->state).conn_cache)->last_cleanup);
        if (999 < tVar27) {
          Curl_conncache_foreach((data->state).conn_cache,data,call_disconnect_if_dead);
          ((data->state).conn_cache)->last_cleanup = tVar42;
        }
        if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) {
LAB_004c4736:
          bVar40 = false;
LAB_004c4738:
          if ((conn->handler->flags & 0x100) != 0) {
            if ((data->set).ssl_enable_alpn == true) {
              (conn->bits).tls_enable_alpn = true;
            }
            if ((data->set).ssl_enable_npn == true) {
              (conn->bits).tls_enable_npn = true;
            }
          }
          if (bVar40) {
LAB_004c4782:
            Curl_infof(data,"No connections available.\n");
            conn_free(conn);
            *local_288 = (connectdata *)0x0;
            CVar9 = CURLE_NO_CONNECTION_AVAILABLE;
            goto LAB_004c1a80;
          }
          pcVar28 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
          if ((pcVar28 != (connectbundle *)0x0 && local_2b0 != 0) &&
             (local_2b0 <= pcVar28->num_connections)) {
            tVar42 = curlx_tvnow();
            lVar25 = -1;
            pcVar30 = (connectdata *)0x0;
            while (pcVar28 = (connectbundle *)(pcVar28->conn_list).head,
                  pcVar28 != (connectbundle *)0x0) {
              pcVar33 = *(connectdata **)pcVar28;
              if ((pcVar33->inuse == false) &&
                 (tVar27 = curlx_tvdiff(tVar42,pcVar33->now), lVar25 < tVar27)) {
                lVar25 = tVar27;
                pcVar30 = pcVar33;
              }
            }
            if (pcVar30 == (connectdata *)0x0) {
              Curl_infof(data,"No more connections allowed to host: %d\n",local_2b0);
              goto LAB_004c4782;
            }
            pcVar30->data = data;
            Curl_disconnect(pcVar30,false);
          }
          connc = (data->state).conn_cache;
          if ((local_290 != 0) && (local_290 <= connc->num_connections)) {
            pcVar30 = Curl_oldest_idle_connection(data);
            if (pcVar30 == (connectdata *)0x0) {
              Curl_infof(data,"No connections available in cache\n");
              goto LAB_004c4782;
            }
            pcVar30->data = data;
            Curl_disconnect(pcVar30,false);
            connc = (data->state).conn_cache;
          }
          Curl_conncache_add_conn(connc,conn);
          if ((((data->state).authhost.picked & 0x28) != 0) && ((data->state).authhost.done == true)
             ) {
            Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
            (data->state).authhost.picked = 0;
            (data->state).authhost.done = false;
          }
          local_320 = conn;
          if ((((data->state).authproxy.picked & 0x28) != 0) &&
             ((data->state).authproxy.done == true)) {
            Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
            (data->state).authproxy.picked = 0;
            (data->state).authproxy.done = false;
          }
        }
        else {
          uVar10 = IsPipeliningPossible(data,conn);
          if (((data->state).authhost.want & 0x28) == 0) {
            bVar40 = false;
          }
          else {
            bVar40 = (conn->handler->protocol & 3) != 0;
          }
          if (((conn->bits).proxy_user_passwd == true) &&
             (((data->state).authproxy.want & 0x28) != 0)) {
            bVar41 = (conn->handler->protocol & 3) != 0;
          }
          else {
            bVar41 = false;
          }
          if ((uVar10 & 1) != 0) {
            _Var31 = Curl_pipeline_site_blacklisted(data,conn);
            if (_Var31) {
              uVar10 = uVar10 & 2;
            }
          }
          pcVar28 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
          if (pcVar28 == (connectbundle *)0x0) goto LAB_004c4736;
          local_2c8 = 0;
          if (pcVar28->multiuse == 2) {
            pcVar15 = "can multiplex";
LAB_004c3902:
            local_2b8 = 0;
          }
          else {
            pcVar15 = "serially";
            if (data->multi == (Curl_multi *)0x0) goto LAB_004c3902;
            local_2b8 = data->multi->max_pipeline_length;
          }
          phVar20 = &conn->host;
          if ((conn->bits).conn_to_host != false) {
            phVar20 = &conn->conn_to_host;
          }
          pcVar17 = "can pipeline";
          if (pcVar28->multiuse != 1) {
            pcVar17 = pcVar15;
          }
          Curl_infof(data,"Found bundle for host %s: %p [%s]\n",phVar20->name,pcVar28,pcVar17);
          if (uVar10 == 0) goto LAB_004c3a1f;
          iVar8 = pcVar28->multiuse;
          if (iVar8 < 1) {
            if ((iVar8 != 0) || ((data->set).pipewait == false)) {
              uVar10 = 0;
              Curl_infof(data,"Server doesn\'t support multi-use (yet)\n");
              iVar8 = pcVar28->multiuse;
              goto LAB_004c39a1;
            }
            bVar40 = true;
            pcVar15 = "Server doesn\'t support multi-use yet, wait\n";
LAB_004c4728:
            Curl_infof(data,pcVar15);
            goto LAB_004c4738;
          }
LAB_004c39a1:
          if (iVar8 == 1) {
            _Var31 = Curl_pipeline_wanted(data->multi,1);
            if (_Var31) {
              iVar8 = pcVar28->multiuse;
              goto LAB_004c39c2;
            }
            pcVar15 = "Could pipeline, but not asked to!\n";
LAB_004c3a07:
            local_2c8 = 0;
            Curl_infof(data,pcVar15);
          }
          else {
LAB_004c39c2:
            if (iVar8 == 2) {
              _Var31 = Curl_pipeline_wanted(data->multi,2);
              local_2c8 = (ulong)uVar10;
              if (!_Var31) {
                pcVar15 = "Could multiplex, but not asked to!\n";
                goto LAB_004c3a07;
              }
            }
            else {
              local_2c8 = (ulong)uVar10;
            }
          }
LAB_004c3a1f:
          local_2f0 = (pcVar28->conn_list).head;
          local_250 = &conn->socks_proxy;
          local_258 = &conn->http_proxy;
          local_260 = local_2b8 - 1;
          uVar22 = local_2b8;
          pcVar30 = (connectdata *)0x0;
          bVar5 = 0;
LAB_004c3a7a:
          bVar34 = bVar5;
          pcVar33 = pcVar30;
          uVar32 = uVar22;
          if (local_2f0 != (curl_llist_element *)0x0) {
            local_320 = (connectdata *)local_2f0->ptr;
            local_2f0 = local_2f0->next;
            _Var31 = disconnect_if_dead(local_320,data);
            uVar22 = uVar32;
            pcVar30 = pcVar33;
            bVar5 = bVar34;
            if (_Var31) goto LAB_004c3a7a;
            uVar39 = (local_320->recv_pipe).size + (local_320->send_pipe).size;
            if ((int)local_2c8 == 0) {
              if (uVar39 != 0) goto LAB_004c3a7a;
              iVar8 = local_320->sock[0];
              _Var31 = (local_320->bits).close;
              if (iVar8 == -1 || (_Var31 & 1U) != 0) {
                Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",
                           local_320->connection_id);
                bVar5 = (_Var31 ^ 1U) & iVar8 == -1 | bVar34;
                goto LAB_004c3a7a;
              }
            }
            else {
              if (((local_320->bits).protoconnstart == true) && ((local_320->bits).close != false))
              goto LAB_004c3a7a;
              if ((local_320->bits).multiplex == false) {
                pcVar29 = (local_320->send_pipe).head;
                if (pcVar29 == (curl_llist_element *)0x0) {
                  pcVar29 = (local_320->recv_pipe).head;
                  if (pcVar29 != (curl_llist_element *)0x0) {
LAB_004c3bc8:
                    pCVar37 = (Curl_easy *)pcVar29->ptr;
                    goto LAB_004c3bcb;
                  }
                }
                else {
                  pCVar37 = (Curl_easy *)pcVar29->ptr;
                  pcVar29 = (local_320->recv_pipe).head;
                  if (pcVar29 == (curl_llist_element *)0x0) {
LAB_004c3bcb:
                    if (pCVar37 == (Curl_easy *)0x0) goto LAB_004c3bec;
                  }
                  else if (pCVar37 == (Curl_easy *)0x0) goto LAB_004c3bc8;
                  uVar10 = IsPipeliningPossible(pCVar37,local_320);
                  if ((uVar10 & 1) == 0) goto LAB_004c3a7a;
                }
              }
            }
LAB_004c3bec:
            pCVar26 = conn->handler;
            if ((((((local_320->handler->flags ^ pCVar26->flags) & 1) == 0) ||
                 ((uVar10 = get_protocol_family(local_320->handler->protocol),
                  uVar10 == pCVar26->protocol && (local_320->tls_upgraded == true)))) &&
                ((conn->bits).httpproxy == (local_320->bits).httpproxy)) &&
               ((_Var31 = (conn->bits).socksproxy, _Var31 == (local_320->bits).socksproxy &&
                ((((_Var31 == false ||
                   (_Var31 = proxy_info_matches(local_250,&local_320->socks_proxy), _Var31)) &&
                  ((conn->bits).conn_to_host == (local_320->bits).conn_to_host)) &&
                 ((conn->bits).conn_to_port == (local_320->bits).conn_to_port)))))) {
              if ((conn->bits).httpproxy == true) {
                _Var31 = proxy_info_matches(local_258,&local_320->http_proxy);
                if ((!_Var31) || ((conn->bits).tunnel_proxy != (local_320->bits).tunnel_proxy))
                goto LAB_004c3a7a;
                if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
                  if ((conn->handler->flags & 1) == 0) {
                    _Var31 = Curl_ssl_config_matches(local_2a8,&local_320->ssl_config);
                    if (!_Var31) goto LAB_004c3a7a;
                    sVar2 = local_320->ssl[0].state;
                  }
                  else {
                    _Var31 = Curl_ssl_config_matches(local_270,&local_320->proxy_ssl_config);
                    if (!_Var31) goto LAB_004c3a7a;
                    sVar2 = local_320->proxy_ssl[0].state;
                  }
                  if (sVar2 != ssl_connection_complete) goto LAB_004c3a7a;
                }
              }
              if (((int)local_2c8 != 0) || (local_320->inuse == false)) {
                pcVar15 = conn->localdev;
                if ((pcVar15 == (char *)0x0 && conn->localport == 0) ||
                   (((local_320->localport == conn->localport &&
                     (local_320->localportrange == conn->localportrange)) &&
                    ((pcVar15 == (char *)0x0 ||
                     ((local_320->localdev != (char *)0x0 &&
                      (iVar8 = strcmp(local_320->localdev,pcVar15), iVar8 == 0)))))))) {
                  pCVar26 = conn->handler;
                  uVar10 = pCVar26->flags;
                  if ((((char)uVar10 < '\0') ||
                      ((iVar8 = strcmp(*local_2a0,local_320->user), iVar8 == 0 &&
                       (iVar8 = strcmp(conn->passwd,local_320->passwd), iVar8 == 0)))) &&
                     ((((uVar10 & 1) == 0 &&
                       (((conn->bits).httpproxy != false && ((conn->bits).tunnel_proxy != true))))
                      || (((iVar8 = Curl_strcasecompare(pCVar26->scheme,local_320->handler->scheme),
                           iVar8 != 0 ||
                           ((uVar10 = get_protocol_family(local_320->handler->protocol),
                            uVar10 == conn->handler->protocol && (local_320->tls_upgraded == true)))
                           ) && (((((conn->bits).conn_to_host != true ||
                                   (iVar8 = Curl_strcasecompare((conn->conn_to_host).name,
                                                                (local_320->conn_to_host).name),
                                   iVar8 != 0)) &&
                                  (((((conn->bits).conn_to_port != true ||
                                     (conn->conn_to_port == local_320->conn_to_port)) &&
                                    (iVar8 = Curl_strcasecompare((conn->host).name,
                                                                 (local_320->host).name), iVar8 != 0
                                    )) && (conn->remote_port == local_320->remote_port)))) &&
                                 (((conn->handler->flags & 1) == 0 ||
                                  ((_Var31 = Curl_ssl_config_matches
                                                       (local_2a8,&local_320->ssl_config), _Var31 &&
                                   (bVar5 = 1, local_320->ssl[0].state == ssl_connection_complete)))
                                  ))))))))) {
                    if (bVar40) {
                      iVar8 = strcmp(*local_2a0,local_320->user);
                      bVar5 = bVar34;
                      if (iVar8 != 0) goto LAB_004c3a7a;
                      cVar12 = strcmp(conn->passwd,local_320->passwd);
                    }
                    else {
                      cVar12 = (local_320->ntlm).state;
                    }
                    bVar5 = bVar34;
                    if (cVar12 == NTLMSTATE_NONE) {
                      if (bVar41) {
                        pcVar15 = (local_320->http_proxy).user;
                        if ((((pcVar15 == (char *)0x0) ||
                             (pcVar17 = (local_320->http_proxy).passwd, pcVar17 == (char *)0x0)) ||
                            (iVar8 = strcmp((conn->http_proxy).user,pcVar15), iVar8 != 0)) ||
                           (iVar8 = strcmp((conn->http_proxy).passwd,pcVar17), iVar8 != 0))
                        goto LAB_004c3a7a;
                      }
                      else {
                        if ((local_320->proxyntlm).state != NTLMSTATE_NONE) goto LAB_004c3a7a;
                        if (!bVar40) {
                          local_310 = local_320;
                          if (((int)local_2c8 == 0) || (uVar39 == 0)) goto LAB_004c433d;
                          if (local_260 < uVar39) {
                            Curl_infof(data,"Pipe is full, skip (%zu)\n",uVar39);
                          }
                          else {
                            _Var31 = Curl_pipeline_penalized(data,local_320);
                            if (_Var31) {
                              Curl_infof(data,"Penalized, skip\n");
                            }
                            else {
                              if (local_2b8 == 0) {
                                Curl_infof(data,"Multiplexed connection found!\n");
                                goto LAB_004c433d;
                              }
                              uVar22 = uVar39;
                              pcVar30 = local_320;
                              if (uVar39 < uVar32) goto LAB_004c3a7a;
                            }
                          }
                          uVar22 = uVar32;
                          pcVar30 = pcVar33;
                          goto LAB_004c3a7a;
                        }
                      }
                      if (((bVar40) && ((local_320->ntlm).state != NTLMSTATE_NONE)) ||
                         ((pcVar30 = local_320, bVar41 &&
                          ((local_320->proxyntlm).state != NTLMSTATE_NONE)))) goto LAB_004c43d2;
                    }
                  }
                }
              }
            }
            goto LAB_004c3a7a;
          }
          local_310 = pcVar33;
          if (pcVar33 == (connectdata *)0x0) {
            if ((bVar34 == 0) || ((data->set).pipewait == false)) goto LAB_004c4736;
            bVar40 = true;
            pcVar15 = "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n";
            goto LAB_004c4728;
          }
LAB_004c433d:
          iVar8 = IsPipeliningPossible(data,local_310);
          if (((iVar8 == 0) || ((local_310->recv_pipe).size + (local_310->send_pipe).size == 0)) ||
             (Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                         local_310->connection_id), local_2b0 <= local_310->bundle->num_connections)
             ) {
            local_320 = local_310;
          }
          else {
            local_320 = local_310;
            if (((data->state).conn_cache)->num_connections < local_290) {
              pcVar15 = "We can reuse, but we want a new connection anyway\n";
              bVar40 = false;
              goto LAB_004c4728;
            }
          }
LAB_004c43d2:
          local_320->inuse = true;
          (*Curl_cfree)((conn->http_proxy).host.rawalloc);
          (*Curl_cfree)((conn->socks_proxy).host.rawalloc);
          Curl_free_primary_ssl_config(local_2a8);
          Curl_free_primary_ssl_config(local_270);
          local_320->data = conn->data;
          _Var31 = (conn->bits).user_passwd;
          (local_320->bits).user_passwd = _Var31;
          if (_Var31 == true) {
            (*Curl_cfree)(local_320->user);
            local_320->user = (char *)0x0;
            (*Curl_cfree)(local_320->passwd);
            local_320->passwd = (char *)0x0;
            pcVar15 = local_2a0[1];
            local_320->user = *local_2a0;
            local_320->passwd = pcVar15;
            local_2a0[0] = (char *)0x0;
            local_2a0[1] = (char *)0x0;
          }
          _Var31 = (conn->bits).proxy_user_passwd;
          (local_320->bits).proxy_user_passwd = _Var31;
          if (_Var31 == true) {
            (*Curl_cfree)((local_320->http_proxy).user);
            (local_320->http_proxy).user = (char *)0x0;
            (*Curl_cfree)((local_320->socks_proxy).user);
            (local_320->socks_proxy).user = (char *)0x0;
            (*Curl_cfree)((local_320->http_proxy).passwd);
            (local_320->http_proxy).passwd = (char *)0x0;
            (*Curl_cfree)((local_320->socks_proxy).passwd);
            (local_320->socks_proxy).passwd = (char *)0x0;
            pcVar15 = (conn->http_proxy).passwd;
            (local_320->http_proxy).user = (conn->http_proxy).user;
            (local_320->http_proxy).passwd = pcVar15;
            pcVar15 = (conn->socks_proxy).passwd;
            (local_320->socks_proxy).user = (conn->socks_proxy).user;
            (local_320->socks_proxy).passwd = pcVar15;
            (conn->socks_proxy).user = (char *)0x0;
            (conn->socks_proxy).passwd = (char *)0x0;
            (conn->http_proxy).user = (char *)0x0;
            (conn->http_proxy).passwd = (char *)0x0;
          }
          (*Curl_cfree)((local_320->host).rawalloc);
          (local_320->host).rawalloc = (char *)0x0;
          (*Curl_cfree)((local_320->conn_to_host).rawalloc);
          (local_320->conn_to_host).rawalloc = (char *)0x0;
          pcVar15 = local_2d0->encalloc;
          pcVar17 = local_2d0->name;
          pcVar18 = local_2d0->dispname;
          (local_320->host).rawalloc = local_2d0->rawalloc;
          (local_320->host).encalloc = pcVar15;
          (local_320->host).name = pcVar17;
          (local_320->host).dispname = pcVar18;
          (local_320->bits).conn_to_host = (conn->bits).conn_to_host;
          pcVar15 = local_268->rawalloc;
          pcVar17 = local_268->encalloc;
          pcVar18 = local_268->dispname;
          (local_320->conn_to_host).name = local_268->name;
          (local_320->conn_to_host).dispname = pcVar18;
          (local_320->conn_to_host).rawalloc = pcVar15;
          (local_320->conn_to_host).encalloc = pcVar17;
          (local_320->bits).conn_to_port = (conn->bits).conn_to_port;
          local_320->conn_to_port = conn->conn_to_port;
          Curl_persistconninfo(local_320);
          (local_320->bits).reuse = true;
          (*Curl_cfree)(conn->user);
          conn->user = (char *)0x0;
          (*Curl_cfree)(conn->passwd);
          conn->passwd = (char *)0x0;
          (*Curl_cfree)((conn->http_proxy).user);
          (conn->http_proxy).user = (char *)0x0;
          (*Curl_cfree)((conn->socks_proxy).user);
          (conn->socks_proxy).user = (char *)0x0;
          (*Curl_cfree)((conn->http_proxy).passwd);
          (conn->http_proxy).passwd = (char *)0x0;
          (*Curl_cfree)((conn->socks_proxy).passwd);
          (conn->socks_proxy).passwd = (char *)0x0;
          (*Curl_cfree)(conn->localdev);
          conn->localdev = (char *)0x0;
          Curl_llist_destroy(local_240,(void *)0x0);
          Curl_llist_destroy(local_248,(void *)0x0);
          (*Curl_cfree)(conn->master_buffer);
          conn->master_buffer = (char *)0x0;
          (*Curl_cfree)(conn);
          *local_288 = local_320;
          pcVar15 = "host";
          if ((local_320->bits).proxy != false) {
            pcVar15 = "proxy";
          }
          lVar25 = 0x128;
          if (((local_320->socks_proxy).host.name == (char *)0x0) &&
             (lVar25 = 0x168, (local_320->http_proxy).host.name == (char *)0x0)) {
            lVar25 = 0xe0;
          }
          Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",
                     local_320->connection_id,pcVar15,
                     *(undefined8 *)((local_320->chunk).hexbuffer + lVar25 + -0x20));
        }
        local_320->inuse = true;
        Curl_init_do(data,local_320);
        CVar9 = setup_range(data);
        if (CVar9 != CURLE_OK) goto LAB_004c1a80;
        local_320->seek_func = (data->set).seek_func;
        local_320->seek_client = (data->set).seek_client;
        tVar27 = Curl_timeleft(data,(timeval *)0x0,true);
        if ((local_320->bits).reuse == true) {
          *local_298 = false;
          CVar9 = CURLE_OK;
          goto LAB_004c1a80;
        }
        if ((local_320->bits).proxy == false) {
          lVar25 = 200;
          if ((local_320->bits).conn_to_host != false) {
            lVar25 = 0xf0;
          }
          iVar8 = *(int *)(local_320->primary_ip + (ulong)(local_320->bits).conn_to_port * 4 + -10);
          local_320->port = (long)iVar8;
          iVar8 = Curl_resolv_timeout(local_320,
                                      *(char **)((local_320->chunk).hexbuffer + lVar25 + -0x10),
                                      iVar8,(Curl_dns_entry **)protobuf,tVar27);
          if (iVar8 == -2) goto LAB_004c4ad9;
          if (iVar8 == 1) goto LAB_004c4a94;
          if (protobuf._0_8_ != 0) goto LAB_004c4aea;
          Curl_failf(data,"Couldn\'t resolve host \'%s\'",
                     *(undefined8 *)((local_320->chunk).hexbuffer + lVar25 + -8));
          CVar9 = CURLE_COULDNT_RESOLVE_HOST;
        }
        else {
          uVar22 = (ulong)(((local_320->bits).socksproxy ^ 1) << 6);
          iVar8 = Curl_resolv_timeout(local_320,
                                      *(char **)((long)&(local_320->socks_proxy).host.name + uVar22)
                                      ,(int)local_320->port,(Curl_dns_entry **)protobuf,tVar27);
          if (iVar8 == -2) {
LAB_004c4ad9:
            CVar9 = CURLE_OPERATION_TIMEDOUT;
          }
          else {
            if (iVar8 == 1) {
LAB_004c4a94:
              *local_298 = true;
            }
            else if (protobuf._0_8_ == 0) {
              Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                         *(undefined8 *)((local_320->chunk).hexbuffer + ((uVar22 | 0x110) - 8)));
              CVar9 = CURLE_COULDNT_RESOLVE_PROXY;
              goto LAB_004c4aed;
            }
LAB_004c4aea:
            CVar9 = CURLE_OK;
          }
        }
LAB_004c4aed:
        local_320->dns_entry = (Curl_dns_entry *)protobuf._0_8_;
        goto LAB_004c1a80;
      }
    }
  }
LAB_004c1a7c:
  CVar9 = CURLE_OUT_OF_MEMORY;
LAB_004c1a80:
  (*Curl_cfree)(local_308);
  (*Curl_cfree)(passwd);
  (*Curl_cfree)(user);
  return CVar9;
LAB_004c31a7:
  bVar5 = *pbVar35;
  pbVar21 = pbVar35;
  if ((ulong)bVar5 == 0) goto LAB_004c31d6;
  if (((((*ppuVar24)[bVar5] & 0x1400) == 0) && (1 < bVar5 - 0x2d)) &&
     ((bVar5 != 0x7e && (bVar5 != 0x5f)))) goto LAB_004c317d;
  pbVar35 = pbVar35 + 1;
  goto LAB_004c31a7;
LAB_004c317d:
  if (bVar5 == 0x5d) {
    *pbVar21 = 0;
    pbVar21 = pbVar21 + 1;
  }
  else {
LAB_004c31d6:
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_004c31e9:
  pcVar17 = strchr((char *)pbVar21,0x3a);
  uVar22 = 0xffffffff;
  if (pcVar17 == (char *)0x0) {
LAB_004c324b:
    pcVar15 = (*Curl_cstrdup)((char *)local_320);
    CVar9 = CURLE_OK;
    if (pcVar15 == (char *)0x0) {
      pcVar15 = (char *)0x0;
      uVar22 = 0xffffffff;
      bVar40 = false;
      CVar9 = CURLE_OUT_OF_MEMORY;
    }
    else {
      bVar40 = true;
    }
  }
  else {
    protobuf[0] = '\0';
    protobuf[1] = '\0';
    protobuf[2] = '\0';
    protobuf[3] = '\0';
    protobuf[4] = '\0';
    protobuf[5] = '\0';
    protobuf[6] = '\0';
    protobuf[7] = '\0';
    *pcVar17 = '\0';
    uVar22 = 0xffffffff;
    if (pcVar17[1] == '\0') goto LAB_004c324b;
    uVar22 = strtol(pcVar17 + 1,(char **)protobuf,10);
    if (((protobuf._0_8_ == 0) || (*(char *)protobuf._0_8_ == '\0')) && (uVar22 < 0x10000))
    goto LAB_004c324b;
    pcVar15 = (char *)0x0;
    Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar17 + 1);
    bVar40 = true;
    uVar22 = 0xffffffff;
    CVar9 = CURLE_OK;
  }
  (*Curl_cfree)(pbVar23);
  if (!bVar40) goto LAB_004c1a80;
  if (pcVar15 == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  else if (*pcVar15 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar15;
    (conn->conn_to_host).name = pcVar15;
    (conn->bits).conn_to_host = true;
    Curl_infof(data,"Connecting to hostname: %s\n",pcVar15);
    goto LAB_004c311a;
  }
LAB_004c30ff:
  (conn->bits).conn_to_host = false;
  (*Curl_cfree)(pcVar15);
  pcVar15 = (char *)0x0;
LAB_004c311a:
  if ((int)uVar22 < 0) {
    (conn->bits).conn_to_port = false;
  }
  else {
    conn->conn_to_port = (int)uVar22;
    (conn->bits).conn_to_port = true;
    Curl_infof(data,"Connecting to port: %d\n",uVar22 & 0xffffffff);
  }
  ppcVar38 = &pcVar3->next;
  goto LAB_004c2f5a;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *conn_temp = NULL;
  size_t urllen;
  char *user = NULL;
  char *passwd = NULL;
  char *options = NULL;
  bool reuse;
  bool prot_missing = FALSE;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;
  size_t max_host_connections = Curl_multi_max_host_connections(data->multi);
  size_t max_total_connections = Curl_multi_max_total_connections(data->multi);

  *async = FALSE;

  /*************************************************************
   * Check input data
   *************************************************************/

  if(!data->change.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  /* This initing continues below, see the comment "Continue connectdata
   * initialization here" */

  /***********************************************************
   * We need to allocate memory to store the path in. We get the size of the
   * full URL to be sure, and we need to make it at least 256 bytes since
   * other parts of the code will rely on this fact
   ***********************************************************/
#define LEAST_PATH_ALLOC 256
  urllen=strlen(data->change.url);
  if(urllen < LEAST_PATH_ALLOC)
    urllen=LEAST_PATH_ALLOC;

  /*
   * We malloc() the buffers below urllen+2 to make room for 2 possibilities:
   * 1 - an extra terminating zero
   * 2 - an extra slash (in case a syntax like "www.host.com?moo" is used)
   */

  Curl_safefree(data->state.pathbuffer);
  data->state.path = NULL;

  data->state.pathbuffer = malloc(urllen+2);
  if(NULL == data->state.pathbuffer) {
    result = CURLE_OUT_OF_MEMORY; /* really bad error */
    goto out;
  }
  data->state.path = data->state.pathbuffer;

  conn->host.rawalloc = malloc(urllen+2);
  if(NULL == conn->host.rawalloc) {
    Curl_safefree(data->state.pathbuffer);
    data->state.path = NULL;
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  conn->host.name = conn->host.rawalloc;
  conn->host.name[0] = 0;

  user = strdup("");
  passwd = strdup("");
  options = strdup("");
  if(!user || !passwd || !options) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  result = parseurlandfillconn(data, conn, &prot_missing, &user, &passwd,
                               &options);
  if(result)
    goto out;

  /*************************************************************
   * No protocol part in URL was used, add it!
   *************************************************************/
  if(prot_missing) {
    /* We're guessing prefixes here and if we're told to use a proxy or if
       we're gonna follow a Location: later or... then we need the protocol
       part added so that we have a valid URL. */
    char *reurl;
    char *ch_lower;

    reurl = aprintf("%s://%s", conn->handler->scheme, data->change.url);

    if(!reurl) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }

    /* Change protocol prefix to lower-case */
    for(ch_lower = reurl; *ch_lower != ':'; ch_lower++)
      *ch_lower = (char)TOLOWER(*ch_lower);

    if(data->change.url_alloc) {
      Curl_safefree(data->change.url);
      data->change.url_alloc = FALSE;
    }

    data->change.url = reurl;
    data->change.url_alloc = TRUE; /* free this later */
  }

  /*************************************************************
   * If the protocol can't handle url query strings, then cut
   * off the unhandable part
   *************************************************************/
  if((conn->given->flags&PROTOPT_NOURLQUERY)) {
    char *path_q_sep = strchr(conn->data->state.path, '?');
    if(path_q_sep) {
      /* according to rfc3986, allow the query (?foo=bar)
         also on protocols that can't handle it.

         cut the string-part after '?'
      */

      /* terminate the string */
      path_q_sep[0] = 0;
    }
  }

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(conn->unix_domain_socket == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(conn);
  if(result)
    goto out;
#endif

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so they
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn, &user, &passwd, &options);
  if(result)
    goto out;
  result = set_login(conn, user, passwd, options);
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;

  /*************************************************************
   * IDN-fix the hostnames
   *************************************************************/
  fix_hostname(conn, &conn->host);
  if(conn->bits.conn_to_host)
    fix_hostname(conn, &conn->conn_to_host);
  if(conn->bits.httpproxy)
    fix_hostname(conn, &conn->http_proxy.host);
  if(conn->bits.socksproxy)
    fix_hostname(conn, &conn->socks_proxy.host);

  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-fixed.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(conn);
  if(result)
    goto out;

  conn->recv[FIRSTSOCKET] = Curl_recv_plain;
  conn->send[FIRSTSOCKET] = Curl_send_plain;
  conn->recv[SECONDARYSOCKET] = Curl_recv_plain;
  conn->send[SECONDARYSOCKET] = Curl_send_plain;

  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /***********************************************************************
   * file: is a special case in that it doesn't need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    result = conn->handler->connect_it(conn, &done);

    /* Setup a "faked" transfer that'll do nothing */
    if(!result) {
      conn->data = data;
      conn->bits.tcpconnect[FIRSTSOCKET] = TRUE; /* we are "connected */

      Curl_conncache_add_conn(data->state.conn_cache, conn);

      /*
       * Setup whatever necessary for a resumed transfer
       */
      result = setup_range(data);
      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(conn, result, FALSE);
        goto out;
      }

      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, /* no download */
                          -1, NULL); /* no upload */
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Get a cloned copy of the SSL config situation stored in the
     connection struct. But to get this going nicely, we must first make
     sure that the strings in the master copy are pointing to the correct
     strings in the session handle strings array!

     Keep in mind that the pointers in the master copy are pointing to strings
     that will be freed as part of the Curl_easy struct, but all cloned
     copies will be separately allocated.
  */
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_ORIG];
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_ORIG];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.ssl.primary.random_file = data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.proxy_ssl.primary.random_file =
    data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.proxy_ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];

  data->set.ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_ORIG];
  data->set.proxy_ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_ORIG];
  data->set.proxy_ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.ssl.cert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.cert = data->set.str[STRING_CERT_PROXY];
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE_ORIG];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.ssl.key = data->set.str[STRING_KEY_ORIG];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE_ORIG];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_ORIG];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
#ifdef USE_TLS_SRP
  data->set.ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_ORIG];
  data->set.proxy_ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_ORIG];
  data->set.proxy_ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif

  if(!Curl_clone_primary_ssl_config(&data->set.ssl.primary,
     &conn->ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  if(!Curl_clone_primary_ssl_config(&data->set.proxy_ssl.primary,
                                    &conn->proxy_ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  prune_dead_connections(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * re-use an already existing one or if we have to create a
   * new one.
   *************************************************************/

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a re-used connection
     already (which happens due to follow-location or during a HTTP
     authentication phase). */
  if(data->set.reuse_fresh && !data->state.this_is_a_follow)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &conn_temp, &force_reuse, &waitpipe);

  /* If we found a reusable connection, we may still want to
     open a new connection if we are pipelining. */
  if(reuse && !force_reuse && IsPipeliningPossible(data, conn_temp)) {
    size_t pipelen = conn_temp->send_pipe.size + conn_temp->recv_pipe.size;
    if(pipelen > 0) {
      infof(data, "Found connection %ld, with requests in the pipe (%zu)\n",
            conn_temp->connection_id, pipelen);

      if(conn_temp->bundle->num_connections < max_host_connections &&
         data->state.conn_cache->num_connections < max_total_connections) {
        /* We want a new connection anyway */
        reuse = FALSE;

        infof(data, "We can reuse, but we want a new connection anyway\n");
      }
    }
  }

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection
     * in the conn_temp variable and thus we need to cleanup the one we
     * just allocated before we can move along and use the previously
     * existing one.
     */
    conn_temp->inuse = TRUE; /* mark this as being in use so that no other
                                handle in a multi stack may nick it */
    reuse_conn(conn, conn_temp);
    free(conn);          /* we don't need this anymore */
    conn = conn_temp;
    *in_connect = conn;

    infof(data, "Re-using existing connection! (#%ld) with %s %s\n",
          conn->connection_id,
          conn->bits.proxy?"proxy":"host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
                                       conn->host.dispname);
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */
    struct connectbundle *bundle = NULL;

    if(conn->handler->flags & PROTOPT_ALPN_NPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
      if(data->set.ssl_enable_npn)
        conn->bits.tls_enable_npn = TRUE;
    }

    if(waitpipe)
      /* There is a connection that *might* become usable for pipelining
         "soon", and we wait for that */
      connections_available = FALSE;
    else
      bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);

    if(max_host_connections > 0 && bundle &&
       (bundle->num_connections >= max_host_connections)) {
      struct connectdata *conn_candidate;

      /* The bundle is full. Let's see if we can kill a connection. */
      conn_candidate = find_oldest_idle_connection_in_bundle(data, bundle);

      if(conn_candidate) {
        /* Set the connection's owner correctly, then kill it */
        conn_candidate->data = data;
        (void)Curl_disconnect(conn_candidate, /* dead_connection */ FALSE);
      }
      else {
        infof(data, "No more connections allowed to host: %d\n",
              max_host_connections);
        connections_available = FALSE;
      }
    }

    if(connections_available &&
       (max_total_connections > 0) &&
       (data->state.conn_cache->num_connections >= max_total_connections)) {
      struct connectdata *conn_candidate;

      /* The cache is full. Let's see if we can kill a connection. */
      conn_candidate = Curl_oldest_idle_connection(data);

      if(conn_candidate) {
        /* Set the connection's owner correctly, then kill it */
        conn_candidate->data = data;
        (void)Curl_disconnect(conn_candidate, /* dead_connection */ FALSE);
      }
      else {
        infof(data, "No connections available in cache\n");
        connections_available = FALSE;
      }
    }

    if(!connections_available) {
      infof(data, "No connections available.\n");

      conn_free(conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      Curl_conncache_add_conn(data->state.conn_cache, conn);
    }

#if defined(USE_NTLM)
    /* If NTLM is requested in a part of this connection, make sure we don't
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked!\n");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked!\n");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Mark the connection as used */
  conn->inuse = TRUE;

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  /*
   * Inherit the proper values from the urldata struct AFTER we have arranged
   * the persistent connection stuff
   */
  conn->seek_func = data->set.seek_func;
  conn->seek_client = data->set.seek_client;

  /*************************************************************
   * Resolve the address of the server or proxy
   *************************************************************/
  result = resolve_server(data, conn, async);

out:

  free(options);
  free(passwd);
  free(user);
  return result;
}